

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_substring_indexBeyondBounds_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 0x10;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14cc8d;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"xxxx01234567xxxx",0x11);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14ccc8;
  pAVar2 = AString_substring(&string,0x10,0xffffffffffffffff);
  if (pAVar2 == (AString *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) substring != NULL";
    pcVar9 = "(void*) substring";
    iVar1 = 0x9bd;
    goto LAB_0014d357;
  }
  uStack_50 = 0x14cce5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bd);
  pcVar8 = (char *)pAVar2->capacity;
  if (pcVar8 != (char *)0x8) {
    iVar1 = 0x9be;
LAB_0014d213:
    local_60 = "(8)";
    pcVar7 = "(*substring).capacity";
    pcVar6 = "(*substring).capacity == (8)";
    local_58 = (char *)0x8;
LAB_0014d3f1:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
    goto LAB_0014d3f3;
  }
  uStack_50 = 0x14cd04;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if (pAVar2->buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (*substring).buffer != NULL";
    pcVar9 = "(void*) (*substring).buffer";
LAB_0014d0ae:
    iVar1 = 0x9be;
LAB_0014d357:
    uStack_50 = 0;
    local_58 = (char *)0x0;
    *(undefined8 *)((long)ppcVar4 + -8) = 0x14d35e;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,pcVar6,pcVar8,pcVar7,pcVar9);
  }
  uStack_50 = 0x14cd20;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  pcVar8 = pAVar2->buffer;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "(null)";
    pcStack_78 = "";
LAB_0014d024:
    uStack_50 = 0;
    local_58 = "\"";
    local_60 = "";
    local_68 = "\"";
    pcStack_70 = "(\"\")";
    pcStack_80 = pcVar8;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9be,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "(*substring).buffer == (\"\")","(*substring).buffer",pcStack_78);
  }
  if (*pcVar8 != '\0') {
    pcStack_78 = "\"";
    goto LAB_0014d024;
  }
  uStack_50 = 0x14cd4f;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if ((char *)pAVar2->size != (char *)0x0) {
    ppcVar4 = &local_68;
    local_60 = "strlen(\"\")";
    pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = "(*substring).size == strlen(\"\")";
    pcVar9 = "(*substring).size";
    local_68 = (char *)pAVar2->size;
    goto LAB_0014d0ae;
  }
  uStack_50 = 0x14cd6d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if (string.capacity != 0x10) {
    local_60 = "(16)";
    pcVar6 = "(string).capacity == (16)";
    pcVar7 = "(string).capacity";
    pcVar8 = (char *)string.capacity;
LAB_0014d1a2:
    iVar1 = 0x9bf;
LAB_0014d3eb:
    local_58 = (char *)0x10;
    goto LAB_0014d3f1;
  }
  uStack_50 = 0x14cd8d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bf);
  if (string.buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar1 = 0x9bf;
    goto LAB_0014d357;
  }
  uStack_50 = 0x14cdaa;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bf);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar8 = "";
    pcVar9 = "(null)";
LAB_0014d136:
    iVar1 = 0x9bf;
  }
  else {
    uStack_50 = 0x14cdca;
    iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
    if (iVar1 != 0) {
      pcVar8 = "\"";
      goto LAB_0014d136;
    }
    uStack_50 = 0x14cde3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9bf);
    if (string.size != 0x10) {
      local_60 = "strlen(\"xxxx01234567xxxx\")";
      pcVar6 = "(string).size == strlen(\"xxxx01234567xxxx\")";
      pcVar7 = "(string).size";
      pcVar8 = (char *)string.size;
      goto LAB_0014d1a2;
    }
    uStack_50 = 0x14ce03;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9bf);
    uStack_50 = 0x14ce0b;
    AString_destruct(pAVar2);
    uStack_50 = 0x14ce1f;
    pAVar2 = AString_substring(&string,0xffffffffffffffff,4);
    if (pAVar2 == (AString *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) substring != NULL";
      pcVar9 = "(void*) substring";
      iVar1 = 0x9c2;
      goto LAB_0014d357;
    }
    uStack_50 = 0x14ce3c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c2);
    pcVar8 = (char *)pAVar2->capacity;
    if (pcVar8 != (char *)0x8) {
      iVar1 = 0x9c3;
      goto LAB_0014d213;
    }
    uStack_50 = 0x14ce5b;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    if (pAVar2->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (*substring).buffer != NULL";
      pcVar9 = "(void*) (*substring).buffer";
LAB_0014d2ee:
      iVar1 = 0x9c3;
      goto LAB_0014d357;
    }
    uStack_50 = 0x14ce77;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    pcVar8 = pAVar2->buffer;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "(null)";
      pcStack_78 = "";
LAB_0014d264:
      uStack_50 = 0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      pcStack_70 = "(\"\")";
      pcStack_80 = pcVar8;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9c3,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(*substring).buffer == (\"\")","(*substring).buffer",pcStack_78);
    }
    if (*pcVar8 != '\0') {
      pcStack_78 = "\"";
      goto LAB_0014d264;
    }
    uStack_50 = 0x14cea6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    if ((char *)pAVar2->size != (char *)0x0) {
      ppcVar4 = &local_68;
      local_60 = "strlen(\"\")";
      pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar7 = "(*substring).size == strlen(\"\")";
      pcVar9 = "(*substring).size";
      local_68 = (char *)pAVar2->size;
      goto LAB_0014d2ee;
    }
    uStack_50 = 0x14cec4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    if (string.capacity != 0x10) {
      local_60 = "(16)";
      pcVar6 = "(string).capacity == (16)";
      pcVar7 = "(string).capacity";
      pcVar8 = (char *)string.capacity;
LAB_0014d3e6:
      iVar1 = 0x9c4;
      goto LAB_0014d3eb;
    }
    uStack_50 = 0x14cee4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c4);
    if (string.buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar1 = 0x9c4;
      goto LAB_0014d357;
    }
    uStack_50 = 0x14cf01;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c4);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar8 = "";
    }
    else {
      uStack_50 = 0x14cf1e;
      iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x14cf37;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9c4);
        if (string.size == 0x10) {
          uStack_50 = 0x14cf57;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9c4);
          uStack_50 = 0x14cf5f;
          AString_destruct(pAVar2);
          uStack_50 = 0x14cf68;
          (*string.deallocator)(string.buffer);
          return;
        }
        local_60 = "strlen(\"xxxx01234567xxxx\")";
        pcVar6 = "(string).size == strlen(\"xxxx01234567xxxx\")";
        pcVar7 = "(string).size";
        pcVar8 = (char *)string.size;
        goto LAB_0014d3e6;
      }
      pcVar8 = "\"";
    }
    iVar1 = 0x9c4;
  }
  pcVar7 = "(string).buffer";
  pcVar6 = "(string).buffer == (\"xxxx01234567xxxx\")";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_60 = "xxxx01234567xxxx";
  local_68 = "\"";
  pcStack_70 = "(\"xxxx01234567xxxx\")";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar8;
LAB_0014d3f3:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_substring_reallocationFailed_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}